

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_clipping.cc
# Opt level: O2

int S2::GetExitAxis(S2PointUVW *n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  S2LogMessage SStack_18;
  
  bVar4 = IntersectsFace(n);
  if (!bVar4) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_clipping.cc"
               ,0x6f,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_18.stream_,"Check failed: IntersectsFace(n) ");
    goto LAB_0022b166;
  }
  dVar2 = n->c_[0];
  dVar3 = n->c_[1];
  dVar5 = ABS(dVar2);
  dVar6 = ABS(dVar3);
  dVar1 = n->c_[2];
  dVar7 = ABS(dVar1);
  dVar8 = ABS(dVar5 - dVar6);
  if ((dVar8 != dVar7) || (NAN(dVar8) || NAN(dVar7))) {
    if (dVar7 <= dVar8) {
LAB_0022b0f6:
      bVar4 = dVar6 <= dVar5;
      goto LAB_0022b0fd;
    }
  }
  else {
    bVar4 = dVar6 <= dVar5 - dVar7;
    if (dVar5 < dVar6) {
      bVar4 = dVar5 <= dVar6 - dVar7;
    }
    if (bVar4) goto LAB_0022b0f6;
  }
  if ((((dVar2 == 0.0) && (!NAN(dVar2))) || ((dVar3 == 0.0 && (!NAN(dVar3))))) ||
     ((dVar1 == 0.0 && (!NAN(dVar1))))) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_clipping.cc"
               ,0x7a,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_18.stream_,"Check failed: n[0] != 0 && n[1] != 0 && n[2] != 0 ");
LAB_0022b166:
    abort();
  }
  bVar4 = -1 < (long)((ulong)dVar1 ^ (ulong)dVar3 ^ (ulong)dVar2);
LAB_0022b0fd:
  return (int)bVar4;
}

Assistant:

static int GetExitAxis(const S2PointUVW& n) {
  S2_DCHECK(IntersectsFace(n));
  if (IntersectsOppositeEdges(n)) {
    // The line passes through through opposite edges of the face.
    // It exits through the v=+1 or v=-1 edge if the u-component of N has a
    // larger absolute magnitude than the v-component.
    return (fabs(n[0]) >= fabs(n[1])) ? 1 : 0;
  } else {
    // The line passes through through two adjacent edges of the face.
    // It exits the v=+1 or v=-1 edge if an even number of the components of N
    // are negative.  We test this using signbit() rather than multiplication
    // to avoid the possibility of underflow.
    S2_DCHECK(n[0] != 0 && n[1] != 0  && n[2] != 0);
    using std::signbit;
    return ((signbit(n[0]) ^ signbit(n[1]) ^ signbit(n[2])) == 0) ? 1 : 0;
  }
}